

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

uint32 __thiscall
Clasp::Solver::simplifyConflictClause(Solver *this,LitVec *cc,ConstraintInfo *info,ClauseHead *rhs)

{
  uint *puVar1;
  pointer pDVar2;
  uint uVar3;
  int iVar4;
  pointer puVar5;
  pointer pLVar6;
  pointer ppVar7;
  uint32 uVar8;
  size_type sVar9;
  uint uVar10;
  ClauseHead *pCVar11;
  ulong uVar12;
  uint uVar13;
  uint32 maxLevel;
  uint uVar14;
  long lVar15;
  pointer ppVar16;
  long *plVar17;
  ulong uVar18;
  bool bVar19;
  Antecedent ante;
  Antecedent local_38;
  
  (this->temp_).ebo_.size = 0;
  uVar8 = ccMinimize(this,cc,&this->temp_,SUB84(this->strategy_,4) >> 9 & 3,this->ccMin_);
  maxLevel = 0;
  if (1 < (cc->ebo_).size) {
    maxLevel = *(uint *)((long)(this->assign_).assign_.ebo_.buf +
                        (ulong)((cc->ebo_).buf[1].rep_ & 0xfffffffc)) >> 4;
  }
  uVar12 = (ulong)(this->temp_).ebo_.size;
  if (uVar12 != 0) {
    puVar5 = (this->assign_).assign_.ebo_.buf;
    pLVar6 = (this->temp_).ebo_.buf;
    uVar18 = 0;
    do {
      puVar1 = (uint *)((long)puVar5 + (ulong)(pLVar6[uVar18].rep_ & 0xfffffffc));
      *puVar1 = *puVar1 & 0xfffffff3;
      uVar18 = uVar18 + 1;
    } while (uVar12 != uVar18);
  }
  if (uVar8 == 1) {
    switch(SUB84(this->strategy_,4) >> 3 & 3) {
    case 0:
      goto switchD_0016b3e0_caseD_0;
    case 1:
      uVar8 = 1;
      break;
    case 2:
      uVar8 = (cc->ebo_).size >> 1;
      break;
    case 3:
      uVar8 = 0xffffffff;
    }
    pLVar6 = (cc->ebo_).buf;
    puVar1 = (uint *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(pLVar6->rep_ & 0xfffffffc));
    *puVar1 = *puVar1 | 0xc;
    local_38 = ccHasReverseArc(this,(Literal)pLVar6[1].rep_,maxLevel,uVar8);
    if (local_38.data_ != 0) {
      (this->conflict_).ebo_.size = 0;
      Antecedent::reason(&local_38,this,(Literal)((cc->ebo_).buf[1].rep_ & 0xfffffffe ^ 2),
                         &this->conflict_);
      ccResolve(this,cc,1,&this->conflict_);
    }
    puVar1 = (uint *)((long)(this->assign_).assign_.ebo_.buf +
                     (ulong)(((cc->ebo_).buf)->rep_ & 0xfffffffc));
    *puVar1 = *puVar1 & 0xfffffff3;
  }
switchD_0016b3e0_caseD_0:
  if (rhs != (ClauseHead *)0x0) {
    (this->conflict_).ebo_.size = 0;
    (*(rhs->super_Constraint)._vptr_Constraint[0x14])(rhs,&this->conflict_);
    sVar9 = (cc->ebo_).size;
    puVar5 = (this->assign_).assign_.ebo_.buf;
    puVar1 = (uint *)((long)puVar5 + (ulong)(((cc->ebo_).buf)->rep_ & 0xfffffffc));
    *puVar1 = *puVar1 | 0xc;
    uVar12 = (ulong)(this->conflict_).ebo_.size;
    bVar19 = sVar9 != 0;
    if (uVar12 != 0 && bVar19) {
      lVar15 = 0;
      do {
        uVar14 = *(uint *)((long)puVar5 +
                          (ulong)(*(uint *)((long)&((this->conflict_).ebo_.buf)->rep_ + lVar15) &
                                 0xfffffffc));
        sVar9 = sVar9 - ((uVar14 & 0xc) != 0 && 0xf < uVar14);
        bVar19 = sVar9 != 0;
        if (uVar12 * 4 + -4 == lVar15) break;
        lVar15 = lVar15 + 4;
      } while (sVar9 != 0);
    }
    if (!bVar19) {
      pCVar11 = otfsRemove(this,rhs,cc);
      if ((pCVar11 != (ClauseHead *)0x0) &&
         (uVar14 = (this->conflict_).ebo_.size, (this->cc_).ebo_.size < uVar14)) {
        pLVar6 = (this->conflict_).ebo_.buf;
        lVar15 = 0;
        do {
          uVar13 = *(uint *)((long)&pLVar6->rep_ + lVar15);
          uVar3 = *(uint *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(uVar13 & 0xfffffffc));
          uVar10 = 1;
          if (uVar3 < 0x10 || (uVar3 & 0xc) == 0) {
            uVar10 = (*(pCVar11->super_Constraint)._vptr_Constraint[0x16])
                               (pCVar11,this,(ulong)uVar13,0);
          }
        } while (((ulong)uVar14 * 4 + -4 != lVar15) && (lVar15 = lVar15 + 4, (uVar10 & 1) != 0));
      }
    }
    puVar1 = (uint *)((long)(this->assign_).assign_.ebo_.buf +
                     (ulong)(((cc->ebo_).buf)->rep_ & 0xfffffffc));
    *puVar1 = *puVar1 & 0xfffffff3;
  }
  uVar13 = SUB84(this->strategy_,0) & 0xffff;
  uVar14 = (this->levels_).super_type.ebo_.size + 1;
  if (uVar14 < uVar13) {
    uVar14 = uVar13;
  }
  uVar8 = 0;
  if (uVar14 <= (cc->ebo_).size) {
    uVar8 = SUB84(this->strategy_,4) >> 0xb & 3;
  }
  uVar8 = finalizeConflictClause(this,cc,info,uVar8);
  uVar12 = (ulong)(this->bumpAct_).ebo_.size;
  if (uVar12 != 0) {
    uVar14 = (info->super_ConstraintScore).rep;
    uVar13 = 0x7f;
    if ((uVar14 & 0x7f00000) != 0) {
      uVar13 = uVar14 >> 0x14 & 0x7f;
    }
    ppVar7 = (this->bumpAct_).ebo_.buf;
    lVar15 = 0;
    ppVar16 = ppVar7;
    do {
      iVar4 = *(int *)((long)&ppVar7->second + lVar15);
      if (iVar4 < (int)uVar13) {
        *(uint *)((long)&ppVar7->second + lVar15) = (iVar4 < 3) + 1;
        (ppVar16->first).rep_ = *(uint32 *)((long)&(ppVar7->first).rep_ + lVar15);
        ppVar16->second = *(int *)((long)&ppVar7->second + lVar15);
        ppVar16 = ppVar16 + 1;
      }
      lVar15 = lVar15 + 8;
    } while (uVar12 << 3 != lVar15);
    uVar14 = (this->bumpAct_).ebo_.size;
    (this->bumpAct_).ebo_.size =
         uVar14 - (int)((long)ppVar7 + ((ulong)uVar14 * 8 - (long)ppVar16) >> 3);
    plVar17 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe);
    (**(code **)(*plVar17 + 0x58))(0x3ff0000000000000,plVar17,this);
  }
  (this->bumpAct_).ebo_.size = 0;
  uVar12 = (ulong)(this->temp_).ebo_.size;
  if (uVar12 != 0) {
    uVar18 = 0;
    do {
      pDVar2 = (this->levels_).super_type.ebo_.buf +
               ((*(uint *)((long)(this->assign_).assign_.ebo_.buf +
                          (ulong)((this->temp_).ebo_.buf[uVar18].rep_ & 0xfffffffc)) >> 4) - 1);
      *(uint *)pDVar2 = *(uint *)pDVar2 & 0xbfffffff;
      uVar18 = uVar18 + 1;
    } while (uVar12 != uVar18);
  }
  (this->temp_).ebo_.size = 0;
  return uVar8;
}

Assistant:

uint32 Solver::simplifyConflictClause(LitVec& cc, ConstraintInfo& info, ClauseHead* rhs) {
	// 1. remove redundant literals from conflict clause
	temp_.clear();
	uint32 onAssert = ccMinimize(cc, temp_, strategy_.ccMinAntes, ccMin_);
	uint32 jl       = cc.size() > 1 ? level(cc[1].var()) : 0;
	// clear seen flags of removed literals - keep levels marked
	for (LitVec::size_type x = 0, stop = temp_.size(); x != stop; ++x) {
		clearSeen(temp_[x].var());
	}
	// 2. check for inverse arcs
	if (onAssert == 1 && strategy_.reverseArcs > 0) {
		uint32 maxN = (uint32)strategy_.reverseArcs;
		if      (maxN > 2) maxN = UINT32_MAX;
		else if (maxN > 1) maxN = static_cast<uint32>(cc.size() / 2);
		markSeen(cc[0].var());
		Antecedent ante = ccHasReverseArc(cc[1], jl, maxN);
		if (!ante.isNull()) {
			// resolve with inverse arc
			conflict_.clear();
			ante.reason(*this, ~cc[1], conflict_);
			ccResolve(cc, 1, conflict_);
		}
		clearSeen(cc[0].var());
	}
	// 3. check if final clause subsumes rhs
	if (rhs) {
		conflict_.clear();
		rhs->toLits(conflict_);
		uint32 open   = (uint32)cc.size();
		markSeen(cc[0].var());
		for (LitVec::const_iterator it = conflict_.begin(), end = conflict_.end(); it != end && open; ++it) {
			// NOTE: at this point the DB might not be fully simplified,
			//       e.g. because of mt or lookahead, hence we must explicitly
			//       check for literals assigned on DL 0
			open -= level(it->var()) > 0 && seen(it->var());
		}
		rhs = open ? 0 : otfsRemove(rhs, &cc);
		if (rhs) { // rhs is subsumed by cc but could not be removed.
			// TODO: we could reuse rhs instead of learning cc
			//       but this would complicate the calling code.
			ClauseHead::BoolPair r(true, false);
			if (cc_.size() < conflict_.size()) {
				//     For now, we only try to strengthen rhs.
				for (LitVec::const_iterator it = conflict_.begin(), end = conflict_.end(); it != end && r.first; ++it) {
					if (!seen(it->var()) || level(it->var()) == 0) {
						r = rhs->strengthen(*this, *it, false);
					}
				}
				if (!r.first) { rhs = 0; }
			}
		}
		clearSeen(cc[0].var());
	}
	// 4. finalize
	uint32 repMode = cc.size() < std::max(strategy_.compress, decisionLevel()+1) ? 0 : strategy_.ccRepMode;
	jl = finalizeConflictClause(cc, info, repMode);
	// 5. bump vars implied by learnt constraints with small lbd
	if (!bumpAct_.empty()) {
		WeightLitVec::iterator j = bumpAct_.begin();
		weight_t newLbd = info.lbd();
		for (WeightLitVec::iterator it = bumpAct_.begin(), end = bumpAct_.end(); it != end; ++it) {
			if (it->second < newLbd) {
				it->second = 1 + (it->second <= 2);
				*j++ = *it;
			}
		}
		bumpAct_.erase(j, bumpAct_.end());
		heuristic_->bump(*this, bumpAct_, 1.0);
	}
	bumpAct_.clear();
	// 6. clear level flags of redundant literals
	for (LitVec::size_type x = 0, stop = temp_.size(); x != stop; ++x) {
		unmarkLevel(level(temp_[x].var()));
	}
	temp_.clear();
	return jl;
}